

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O3

void __thiscall Transformed::Transformed(Transformed *this,Primitive *inner,mat4f *m)

{
  AABox *a;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  mat4f a_00;
  long lVar8;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  vec3f vVar9;
  undefined1 in_stack_00000000 [48];
  AABox t;
  point boundpoints [8];
  point local_110;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  undefined8 uStackY_e0;
  undefined8 local_d8;
  undefined8 uStackY_d0;
  undefined8 local_c8;
  undefined8 uStackY_c0;
  undefined8 local_b8;
  undefined8 uStackY_b0;
  AABox local_a0;
  vec3f local_88;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_intersect_00169ae0;
  this->inner = inner;
  uVar1 = *(undefined8 *)m->data[0];
  uVar2 = *(undefined8 *)(m->data[0] + 2);
  uVar3 = *(undefined8 *)m->data[1];
  uVar4 = *(undefined8 *)(m->data[1] + 2);
  uVar5 = *(undefined8 *)m->data[2];
  uVar6 = *(undefined8 *)(m->data[2] + 2);
  uVar7 = *(undefined8 *)(m->data[3] + 2);
  *(undefined8 *)(this->trans).data[3] = *(undefined8 *)m->data[3];
  *(undefined8 *)((this->trans).data[3] + 2) = uVar7;
  *(undefined8 *)(this->trans).data[2] = uVar5;
  *(undefined8 *)((this->trans).data[2] + 2) = uVar6;
  *(undefined8 *)(this->trans).data[1] = uVar3;
  *(undefined8 *)((this->trans).data[1] + 2) = uVar4;
  *(undefined8 *)(this->trans).data[0] = uVar1;
  *(undefined8 *)((this->trans).data[0] + 2) = uVar2;
  local_e8 = *(undefined8 *)m->data[0];
  uStackY_e0 = *(undefined8 *)(m->data[0] + 2);
  local_d8 = *(undefined8 *)m->data[1];
  uStackY_d0 = *(undefined8 *)(m->data[1] + 2);
  local_c8 = *(undefined8 *)m->data[2];
  uStackY_c0 = *(undefined8 *)(m->data[2] + 2);
  local_b8 = *(undefined8 *)m->data[3];
  uStackY_b0 = *(undefined8 *)(m->data[3] + 2);
  a_00.data[0]._8_8_ = unaff_R15;
  a_00.data[0]._0_8_ = unaff_R14;
  a_00.data._16_48_ = in_stack_00000000;
  inverse(a_00);
  a = &this->bound;
  (*inner->_vptr_Primitive[1])(&local_100,inner);
  if ((((1e+20 <= local_fc) || (1e+20 <= local_f4)) || (1e+20 <= local_ec)) ||
     (((local_100 <= -1e+20 || (local_f8 <= -1e+20)) || (local_f0 <= -1e+20)))) {
    (this->bound).z1 = -INFINITY;
    (this->bound).z2 = INFINITY;
    a->x1 = -INFINITY;
    a->x2 = INFINITY;
    (this->bound).y1 = -INFINITY;
    (this->bound).y2 = INFINITY;
  }
  else {
    local_88.x = local_100;
    local_88.y = local_f8;
    local_88.z = local_f0;
    local_7c = local_100;
    local_78 = local_f8;
    local_74 = local_ec;
    local_70 = local_100;
    local_6c = local_f4;
    local_68 = local_f0;
    local_64 = local_100;
    local_60 = local_f4;
    local_5c = local_ec;
    local_58 = local_fc;
    local_54 = local_f8;
    local_50 = local_f0;
    local_4c = local_fc;
    local_48 = local_f8;
    local_44 = local_ec;
    local_40 = local_fc;
    local_3c = local_f4;
    local_38 = local_f0;
    local_34 = local_fc;
    local_30 = local_f4;
    local_2c = local_ec;
    vVar9 = transformedPoint(&this->trans,&local_88);
    (this->bound).x1 = vVar9.x;
    (this->bound).x2 = vVar9.x;
    (this->bound).y1 = vVar9.y;
    (this->bound).y2 = vVar9.y;
    (this->bound).z1 = vVar9.z;
    (this->bound).z2 = vVar9.z;
    lVar8 = 0xc;
    do {
      vVar9 = transformedPoint(&this->trans,(vec3f *)((long)&local_88.x + lVar8));
      local_110.z = vVar9.z;
      local_110._0_8_ = vVar9._0_8_;
      operator+(&local_a0,a,&local_110);
      (this->bound).z1 = local_a0.z1;
      (this->bound).z2 = local_a0.z2;
      a->x1 = local_a0.x1;
      a->x2 = local_a0.x2;
      (this->bound).y1 = local_a0.y1;
      (this->bound).y2 = local_a0.y2;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 != 0x60);
  }
  return;
}

Assistant:

Transformed(Primitive* inner, const mat4f& m):
		inner(inner), trans(m), invTrans(inverse(m))
	{
		// calculate bounding box of transformed shape
		// (though this bound might be looser)
		AABox t = inner->boundingVolume();
		if (t.finite()) {
			point boundpoints[] = {
				vec3f(t.x1, t.y1, t.z1),
				vec3f(t.x1, t.y1, t.z2),
				vec3f(t.x1, t.y2, t.z1),
				vec3f(t.x1, t.y2, t.z2),
				vec3f(t.x2, t.y1, t.z1),
				vec3f(t.x2, t.y1, t.z2),
				vec3f(t.x2, t.y2, t.z1),
				vec3f(t.x2, t.y2, t.z2)
			};
			bound = AABox(transformedPoint(trans, boundpoints[0]));
			for (int i=1; i<8; ++i)
				bound = bound + transformedPoint(trans, boundpoints[i]);
		}
		else {
			bound = AABox::infAAB;
		}
	}